

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall Liby::EventQueue::start(EventQueue *this)

{
  Channel *pCVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pCVar1 = (this->eventChanelPtr_)._M_t.
           super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
           super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
           super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
  pCVar1->readable_ = true;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventQueue.cpp:53:29)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventQueue.cpp:53:29)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_()>::operator=(&pCVar1->erroEventCallback_,(function<void_()> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventQueue.cpp:54:29)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventQueue.cpp:54:29)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_()>::operator=
            (&((this->eventChanelPtr_)._M_t.
               super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
               super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
               super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl)->readEventCallback_,
             (function<void_()> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  Channel::addChannel((this->eventChanelPtr_)._M_t.
                      super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t
                      .super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
                      super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl);
  return;
}

Assistant:

void EventQueue::start() {
    eventChanelPtr_->enableRead();
    eventChanelPtr_->onErro([this] { destroy(); });
    eventChanelPtr_->onRead([this] {
        if (!eventfp_)
            return;

        char buf[128];
        int ret = ::read(eventfd_, buf, 128);
        if (ret <= 0)
            return;

        while (!eventHandlers_.empty()) {
            eventHandlers_.pop_front()();
        }
    });
    eventChanelPtr_->addChannel();
}